

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cache.cpp
# Opt level: O3

void __thiscall duckdb::VectorCacheBuffer::~VectorCacheBuffer(VectorCacheBuffer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var1;
  
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorCacheBuffer_0244ee30;
  this_00 = (this->auxiliary).internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
  ::~vector(&(this->child_caches).
             super_vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
           );
  AllocatedData::~AllocatedData(&this->owned_data);
  LogicalType::~LogicalType(&this->type);
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorBuffer_0244e900;
  AllocatedData::~AllocatedData(&(this->super_VectorBuffer).data);
  _Var1._M_head_impl =
       (this->super_VectorBuffer).aux_data.
       super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (VectorAuxiliaryData *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
  }
  operator_delete(this);
  return;
}

Assistant:

explicit VectorCacheBuffer(Allocator &allocator, const LogicalType &type_p, idx_t capacity_p = STANDARD_VECTOR_SIZE)
	    : VectorBuffer(VectorBufferType::OPAQUE_BUFFER), type(type_p), capacity(capacity_p) {
		auto internal_type = type.InternalType();
		switch (internal_type) {
		case PhysicalType::LIST: {
			// memory for the list offsets
			owned_data = allocator.Allocate(capacity * GetTypeIdSize(internal_type));
			// child data of the list
			auto &child_type = ListType::GetChildType(type);
			child_caches.push_back(make_buffer<VectorCacheBuffer>(allocator, child_type, capacity));
			auto child_vector = make_uniq<Vector>(child_type, false, false);
			auxiliary = make_shared_ptr<VectorListBuffer>(std::move(child_vector));
			break;
		}
		case PhysicalType::ARRAY: {
			auto &child_type = ArrayType::GetChildType(type);
			auto array_size = ArrayType::GetSize(type);
			child_caches.push_back(make_buffer<VectorCacheBuffer>(allocator, child_type, array_size * capacity));
			auto child_vector = make_uniq<Vector>(child_type, true, false, array_size * capacity);
			auxiliary = make_shared_ptr<VectorArrayBuffer>(std::move(child_vector), array_size, capacity);
			break;
		}
		case PhysicalType::STRUCT: {
			auto &child_types = StructType::GetChildTypes(type);
			for (auto &child_type : child_types) {
				child_caches.push_back(make_buffer<VectorCacheBuffer>(allocator, child_type.second, capacity));
			}
			auto struct_buffer = make_shared_ptr<VectorStructBuffer>(type);
			auxiliary = std::move(struct_buffer);
			break;
		}
		default:
			owned_data = allocator.Allocate(capacity * GetTypeIdSize(internal_type));
			break;
		}
	}